

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O0

size_t apduRespEnc(octet *apdu,apdu_resp_t *resp)

{
  undefined1 *in_RSI;
  long in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  if (in_RDI != 0) {
    memCopy(in_RSI,in_stack_ffffffffffffffe8,0x121bf2);
    *(undefined1 *)(in_RDI + *(long *)(in_RSI + 8)) = *in_RSI;
    *(undefined1 *)(in_RDI + 1 + *(long *)(in_RSI + 8)) = in_RSI[1];
  }
  return *(long *)(in_RSI + 8) + 2;
}

Assistant:

size_t apduRespEnc(octet apdu[], const apdu_resp_t* resp)
{
	// pre
	ASSERT(apduRespIsValid(resp));
	// кодировать
	if (apdu)
	{
		ASSERT(memIsValid(apdu, resp->rdf_len + 2));
		memCopy(apdu, resp->rdf, resp->rdf_len);
		apdu[resp->rdf_len] = resp->sw1, apdu[resp->rdf_len + 1] = resp->sw2;
	}
	// возвратить длину кода
	return resp->rdf_len + 2;
}